

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

Antecedent __thiscall
Clasp::Solver::ccHasReverseArc(Solver *this,Literal p,uint32 maxLevel,uint32 maxNew)

{
  pointer plVar1;
  buf_type *pbVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  Antecedent ante;
  Antecedent local_40;
  uint32 local_34;
  
  local_40.data_ = 0;
  uVar6 = p.rep_ >> 1;
  local_34 = maxNew;
  if (((this->shared_->btig_).graph_.ebo_.size <= uVar6) ||
     (bVar4 = ShortImplicationsGraph::reverseArc(&this->shared_->btig_,this,p,maxLevel,&local_40),
     !bVar4)) {
    plVar1 = (this->watches_).ebo_.buf;
    uVar8 = (ulong)plVar1[uVar6].super_type.
                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_;
    if (uVar8 != 0) {
      pbVar2 = plVar1[uVar6].super_type.
               super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
      uVar7 = 0;
      do {
        plVar3 = *(long **)(pbVar2 + uVar7);
        cVar5 = (**(code **)(*plVar3 + 0xa8))(plVar3,this,p.rep_ & 0xfffffffe ^ 2,maxLevel,local_34)
        ;
        if (cVar5 != '\0') {
          return (Antecedent)*(uint64 *)(pbVar2 + uVar7);
        }
        uVar7 = uVar7 + 8;
      } while (uVar8 != uVar7);
    }
  }
  return (Antecedent)local_40.data_;
}

Assistant:

Antecedent Solver::ccHasReverseArc(Literal p, uint32 maxLevel, uint32 maxNew) {
	assert(seen(p.var()) && isFalse(p) && level(p.var()) == maxLevel);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	Antecedent ante;
	if (p.id() < btig.size() && btig.reverseArc(*this, p, maxLevel, ante)) { return ante; }
	WatchList& wl = watches_[p.id()];
	for (WatchList::left_iterator it = wl.left_begin(), end = wl.left_end();  it != end;  ++it) {
		if (it->head->isReverseReason(*this, ~p, maxLevel, maxNew)) {
			return it->head;
		}
	}
	return ante;
}